

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_ffh_assert(lua_State *L)

{
  ulong uVar1;
  GCstr *pGVar2;
  
  lj_lib_checkany(L,1);
  if (L->top == L->base + 1) {
    lj_err_caller(L,LJ_ERR_ASSERT);
  }
  uVar1 = L->base[1].it64 >> 0x2f;
  if (uVar1 == 0xfffffffffffffffb || uVar1 < 0xfffffffffffffff3) {
    pGVar2 = lj_lib_checkstr(L,2);
    lj_err_callermsg(L,(char *)(pGVar2 + 1));
  }
  lj_err_run(L);
}

Assistant:

LJLIB_ASM(assert)		LJLIB_REC(.)
{
  lj_lib_checkany(L, 1);
  if (L->top == L->base+1)
    lj_err_caller(L, LJ_ERR_ASSERT);
  else if (tvisstr(L->base+1) || tvisnumber(L->base+1))
    lj_err_callermsg(L, strdata(lj_lib_checkstr(L, 2)));
  else
    lj_err_run(L);
  return FFH_UNREACHABLE;
}